

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinMd5
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  allocator_type *in_RCX;
  Value VVar1;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  string value;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_90;
  string local_78;
  UString local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value,"md5",(allocator<char> *)&local_78);
  local_58._M_dataplus._M_p._0_4_ = 0x13;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_58;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)&local_90,__l,in_RCX);
  validateBuiltinArgs(this,loc,&value,args,
                      (vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                       *)&local_90);
  std::
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~_Vector_base(&local_90);
  std::__cxx11::string::~string((string *)&value);
  encode_utf8(&value,(UString *)
                     ((((args->
                        super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                        )._M_impl.super__Vector_impl_data._M_start)->v).h + 1));
  std::__cxx11::string::string((string *)&local_38,(string *)&value);
  md5(&local_78,&local_38);
  decode_utf8(&local_58,&local_78);
  VVar1 = makeString(this,&local_58);
  (this->scratch).t = STRING;
  (this->scratch).v = VVar1._0_8_;
  std::__cxx11::u32string::~u32string((u32string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&value);
  return (AST *)0x0;
}

Assistant:

const AST *builtinMd5(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "md5", args, {Value::STRING});

        std::string value = encode_utf8(static_cast<HeapString *>(args[0].v.h)->value);

        scratch = makeString(decode_utf8(md5(value)));
        return nullptr;
    }